

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

value_type * __thiscall
FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>
::fastAccessDx(value_type *__return_storage_ptr__,
              FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>
              *this,int i)

{
  FadExpr<FadUnaryMin<Fad<double>_>_> local_38;
  Fad<double> local_30;
  
  FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>::
  fastAccessDx(&local_30,&this->expr_->fadexpr_,i);
  local_38.fadexpr_.expr_ = (FadUnaryMin<Fad<double>_>)(FadUnaryMin<Fad<double>_>)&local_30;
  Fad<double>::Fad<FadUnaryMin<Fad<double>>>(__return_storage_ptr__,&local_38);
  Fad<double>::~Fad(&local_30);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return - expr_.fastAccessDx(i);}